

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

String __thiscall testing::internal::StringStreamToString(internal *this,stringstream *ss)

{
  long *plVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  long lVar3;
  String SVar4;
  stringstream helper;
  long *local_1f8;
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringbuf::str();
  plVar1 = local_1d8;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (local_1d0 != 0) {
    lVar3 = 0;
    do {
      if (*(char *)((long)plVar1 + lVar3) == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\\0",2);
      }
      else {
        std::ostream::put((char)local_1a8);
      }
      lVar3 = lVar3 + 1;
    } while (local_1d0 != lVar3);
  }
  std::__cxx11::stringbuf::str();
  String::String((String *)this,(char *)local_1f8);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  sVar2 = extraout_RDX;
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
    sVar2 = extraout_RDX_00;
  }
  SVar4.length_ = sVar2;
  SVar4.c_str_ = (char *)this;
  return SVar4;
}

Assistant:

String StringStreamToString(::std::stringstream* ss) {
  const ::std::string& str = ss->str();
  const char* const start = str.c_str();
  const char* const end = start + str.length();

  // We need to use a helper stringstream to do this transformation
  // because String doesn't support push_back().
  ::std::stringstream helper;
  for (const char* ch = start; ch != end; ++ch) {
    if (*ch == '\0') {
      helper << "\\0";  // Replaces NUL with "\\0";
    } else {
      helper.put(*ch);
    }
  }

  return String(helper.str().c_str());
}